

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_259311b::SADx3Test_SrcAlignedByWidth_Test::TestBody
          (SADx3Test_SrcAlignedByWidth_Test *this)

{
  SADTestBase *this_00;
  uint8_t *puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  puVar1 = (anonymous_namespace)::SADTestBase::source_data_;
  this_00 = &(this->super_SADx3Test).super_SADTestBase;
  (anonymous_namespace)::SADTestBase::source_data_ =
       (anonymous_namespace)::SADTestBase::source_data_ +
       (this->super_SADx3Test).super_SADTestBase.width_;
  SADTestBase::FillRandom
            (this_00,(anonymous_namespace)::SADTestBase::source_data_,
             (this->super_SADx3Test).super_SADTestBase.source_stride_);
  iVar2 = (*(this->super_SADx3Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,0);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var,iVar2),
             (this->super_SADx3Test).super_SADTestBase.reference_stride_);
  iVar2 = (*(this->super_SADx3Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,1);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var_00,iVar2),
             (this->super_SADx3Test).super_SADTestBase.reference_stride_);
  iVar2 = (*(this->super_SADx3Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,2);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var_01,iVar2),
             (this->super_SADx3Test).super_SADTestBase.reference_stride_);
  iVar2 = (*(this->super_SADx3Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,3);
  SADTestBase::FillRandom
            (this_00,(uint8_t *)CONCAT44(extraout_var_02,iVar2),
             (this->super_SADx3Test).super_SADTestBase.reference_stride_);
  SADx3Test::CheckSADs(&this->super_SADx3Test);
  (anonymous_namespace)::SADTestBase::source_data_ = puVar1;
  return;
}

Assistant:

TEST_P(SADx3Test, SrcAlignedByWidth) {
  uint8_t *tmp_source_data = source_data_;
  source_data_ += width_;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  source_data_ = tmp_source_data;
}